

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void Memory::Recycler::WBVerifyBitIsSet(char *addr,char *target)

{
  HeapBlock *pHVar1;
  HeapBlock *heapBlock;
  Recycler *recycler;
  AutoCriticalSection lock;
  char *target_local;
  char *addr_local;
  
  lock.cs = (CriticalSection *)target;
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&recycler,&recyclerListLock);
  heapBlock = (HeapBlock *)recyclerList;
  do {
    if (heapBlock == (HeapBlock *)0x0) {
LAB_009ace68:
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&recycler);
      return;
    }
    pHVar1 = FindHeapBlock((Recycler *)heapBlock,(void *)((ulong)addr & 0xfffffffffffffff0));
    if (pHVar1 != (HeapBlock *)0x0) {
      (*pHVar1->_vptr_HeapBlock[3])(pHVar1,addr);
      goto LAB_009ace68;
    }
    heapBlock = *(HeapBlock **)&heapBlock[0xb36].heapBlockType;
  } while( true );
}

Assistant:

void
Recycler::WBVerifyBitIsSet(char* addr, char* target)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            heapBlock->WBVerifyBitIsSet(addr);
            break;
        }
        recycler = recycler->next;
    }
}